

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

lws_vhost * lws_select_vhost(lws_context *context,int port,char *servername)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  lws_vhost *plVar6;
  lws_vhost *plVar7;
  
  plVar6 = context->vhost_list;
  sVar3 = strlen(servername);
  pcVar4 = strchr(servername,0x3a);
  iVar5 = (int)pcVar4 - (int)servername;
  if (pcVar4 == (char *)0x0) {
    iVar5 = (int)sVar3;
  }
  plVar7 = plVar6;
  while( true ) {
    if (plVar7 == (lws_vhost *)0x0) {
      plVar7 = plVar6;
      while( true ) {
        if (plVar7 == (lws_vhost *)0x0) {
          while( true ) {
            if (plVar6 == (lws_vhost *)0x0) {
              return (lws_vhost *)0x0;
            }
            if ((port != 0) && (plVar6->listen_port == port)) break;
            plVar6 = plVar6->vhost_next;
          }
          _lws_log(8,"%s: vhost match to %s based on port %d\n","lws_select_vhost",plVar6->name,port
                  );
          return plVar6;
        }
        pcVar4 = plVar7->name;
        sVar3 = strlen(pcVar4);
        if ((((port != 0) && (plVar7->listen_port == port)) &&
            (uVar2 = (uint)sVar3, (int)uVar2 <= iVar5 + -2)) &&
           ((servername[(int)(~uVar2 + iVar5)] == '.' &&
            (iVar1 = strncmp(pcVar4,servername + ((long)iVar5 - (long)(int)uVar2),(long)(int)uVar2),
            iVar1 == 0)))) break;
        plVar7 = plVar7->vhost_next;
      }
      _lws_log(8,"SNI: Found %s on wildcard: %s\n",servername,pcVar4);
      return plVar7;
    }
    if ((plVar7->listen_port == port) &&
       (iVar1 = strncmp(plVar7->name,servername,(long)iVar5), iVar1 == 0)) break;
    plVar7 = plVar7->vhost_next;
  }
  _lws_log(8,"SNI: Found: %s\n",servername);
  return plVar7;
}

Assistant:

struct lws_vhost *
lws_select_vhost(struct lws_context *context, int port, const char *servername)
{
	struct lws_vhost *vhost = context->vhost_list;
	const char *p;
	int n, colon;

	n = (int)strlen(servername);
	colon = n;
	p = strchr(servername, ':');
	if (p)
		colon = lws_ptr_diff(p, servername);

	/* Priotity 1: first try exact matches */

	while (vhost) {
		if (port == vhost->listen_port &&
		    !strncmp(vhost->name, servername, colon)) {
			lwsl_info("SNI: Found: %s\n", servername);
			return vhost;
		}
		vhost = vhost->vhost_next;
	}

	/*
	 * Priority 2: if no exact matches, try matching *.vhost-name
	 * unintentional matches are possible but resolve to x.com for *.x.com
	 * which is reasonable.  If exact match exists we already chose it and
	 * never reach here.  SSL will still fail it if the cert doesn't allow
	 * *.x.com.
	 */
	vhost = context->vhost_list;
	while (vhost) {
		int m = (int)strlen(vhost->name);
		if (port && port == vhost->listen_port &&
		    m <= (colon - 2) &&
		    servername[colon - m - 1] == '.' &&
		    !strncmp(vhost->name, servername + colon - m, m)) {
			lwsl_info("SNI: Found %s on wildcard: %s\n",
				    servername, vhost->name);
			return vhost;
		}
		vhost = vhost->vhost_next;
	}

	/* Priority 3: match the first vhost on our port */

	vhost = context->vhost_list;
	while (vhost) {
		if (port && port == vhost->listen_port) {
			lwsl_info("%s: vhost match to %s based on port %d\n",
					__func__, vhost->name, port);
			return vhost;
		}
		vhost = vhost->vhost_next;
	}

	/* no match */

	return NULL;
}